

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_reserve_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *expr;
  ulong uVar4;
  int line;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  size_t local_30;
  size_t local_28;
  void *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 8;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_20 = private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  for (uVar4 = 0; uVar4 < 7; uVar4 = uVar4 + 1) {
    *(undefined1 *)((long)local_20 + uVar4) = 0x35;
  }
  *(undefined1 *)((long)local_20 + 7) = 0x30;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_48,0x20,false,1);
  if (bVar1 == true) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0xf3);
    if (local_30 == 8) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0xf4);
      if (local_28 == 0x20) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0xf5);
        if (local_20 == (void *)0x0) {
          sVar2 = 0;
          pcVar8 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar5 = "(void*) array.buffer != NULL";
          pcVar6 = "(void*) array.buffer";
          line = 0xf6;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0xf6);
          for (lVar7 = 0; lVar7 != 7; lVar7 = lVar7 + 1) {
            if ((long)*(char *)((long)local_20 + lVar7) != 0x35) {
              pcVar8 = "\'5\'";
              expr = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
              pcVar5 = "array.buffer[i] == \'5\'";
              pcVar6 = "array.buffer[i]";
              line = 0xf8;
              sVar2 = (long)*(char *)((long)local_20 + lVar7);
              goto LAB_0010b443;
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xf8);
          }
          sVar2 = (size_t)*(char *)((long)local_20 + 7);
          if (sVar2 == 0x30) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0xf9);
            if (local_38 == (code *)0x0) {
              sVar2 = 0;
              pcVar8 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar5 = "(void*) array.growStrategy != NULL";
              pcVar6 = "(void*) array.growStrategy";
              line = 0xfa;
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0xfa);
              if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0xfb);
                (*pcStack_40)(local_20);
                return;
              }
              pcVar8 = "1";
              expr = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar5 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
              pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
              line = 0xfb;
              sVar2 = private_ACUtilsTest_ADynArray_reallocCount;
            }
          }
          else {
            pcVar8 = "\'0\'";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar5 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
            pcVar6 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
            line = 0xf9;
          }
        }
      }
      else {
        pcVar8 = "private_ACUtilsTest_ADynArray_capacityMax";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar5 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMax";
        pcVar6 = "array.capacity";
        line = 0xf5;
        sVar2 = local_28;
      }
    }
    else {
      pcVar8 = "private_ACUtilsTest_ADynArray_capacityMin";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar5 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar6 = "array.size";
      line = 0xf4;
      sVar2 = local_30;
    }
  }
  else {
    sVar2 = (size_t)bVar1;
    pcVar8 = "true";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar6 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer))"
    ;
    line = 0xf3;
  }
LAB_0010b443:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar3,pcVar5,pcVar6,sVar2,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_success_notEnoughCapacity)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMax);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}